

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_test_decode_version2_Test::
LoginMessageTest_test_decode_version2_Test(LoginMessageTest_test_decode_version2_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00270a80;
  return;
}

Assistant:

TEST(LoginMessageTest, test_decode_version2)
{
    ByteBuffer buffer = BufferUtil::StringAsBuffer(ENCODED_MESSAGE_V2);
    LoginMessage decoded = Decode(buffer, PixieVersion::VERSION2);
    EXPECT_EQ(USERNAME, decoded.GetUsername());
    EXPECT_EQ(PASSWORD, decoded.GetPassword());
    EXPECT_EQ(ALIAS, decoded.GetAlias());
    EXPECT_EQ(APPLICATION, decoded.GetApplication());
    EXPECT_EQ(APPLICATION_VERSION, decoded.GetApplicationVersion());
}